

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool bitset_container_negation_range
                (bitset_container_t *src,int range_start,int range_end,container_t **dst)

{
  uint64_t *puVar1;
  int iVar2;
  bitset_container_t *bitset;
  array_container_t *paVar3;
  ulong uVar4;
  uint uVar5;
  
  bitset = bitset_container_clone(src);
  if (range_start != range_end) {
    puVar1 = bitset->words;
    uVar4 = (ulong)((uint)range_start >> 6);
    uVar5 = range_end - 1U >> 6;
    puVar1[uVar4] = ~(-1L << ((byte)range_start & 0x3f) ^ puVar1[uVar4]);
    if ((uint)range_start >> 6 < uVar5) {
      do {
        puVar1[uVar4] = ~puVar1[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
    puVar1[uVar5] = puVar1[uVar5] ^ 0xffffffffffffffffU >> (-(char)range_end & 0x3fU);
  }
  iVar2 = bitset_container_compute_cardinality(bitset);
  bitset->cardinality = iVar2;
  if (iVar2 < 0x1001) {
    paVar3 = array_container_from_bitset(bitset);
    *dst = paVar3;
    bitset_container_free(bitset);
  }
  else {
    *dst = bitset;
  }
  return 0x1000 < iVar2;
}

Assistant:

bool bitset_container_negation_range(
    const bitset_container_t *src,
    const int range_start, const int range_end,
    container_t **dst
){
    // TODO maybe consider density-based estimate
    // and sometimes build result directly as array, with
    // conversion back to bitset if wrong.  Or determine
    // actual result cardinality, then go directly for the known final cont.

    // keep computation using bitsets as long as possible.
    bitset_container_t *t = bitset_container_clone(src);
    bitset_flip_range(t->words, (uint32_t)range_start, (uint32_t)range_end);
    t->cardinality = bitset_container_compute_cardinality(t);

    if (t->cardinality > DEFAULT_MAX_SIZE) {
        *dst = t;
        return true;
    } else {
        *dst = array_container_from_bitset(t);
        bitset_container_free(t);
        return false;
    }
}